

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<char>_> *
kj::parse::Many_<kj::parse::CharGroup_,_false>::Impl<capnp::compiler::Lexer::ParserInput,_char>::
apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,ParserInput *input)

{
  bool bVar1;
  NullableValue<char> *other;
  char *pcVar2;
  Array<char> local_98;
  int local_7c;
  undefined1 local_78 [2];
  NullableValue<char> local_76 [4];
  NullableValue<char> subResult;
  undefined1 local_68 [8];
  ParserInput subInput;
  Results results;
  ParserInput *input_local;
  CharGroup_ *subParser_local;
  
  Vector<char>::Vector((Vector<char> *)&subInput.begin);
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      (&input->super_IteratorInput<char,_const_char_*>);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    capnp::compiler::Lexer::ParserInput::ParserInput((ParserInput *)local_68,input);
    CharGroup_::operator()((CharGroup_ *)local_78,(ParserInput *)subParser);
    other = kj::_::readMaybe<char>((Maybe<char> *)local_78);
    kj::_::NullableValue<char>::NullableValue((NullableValue<char> *)(local_78 + 2),other);
    Maybe<char>::~Maybe((Maybe<char> *)local_78);
    pcVar2 = kj::_::NullableValue::operator_cast_to_char_((NullableValue *)(local_78 + 2));
    if (pcVar2 == (char *)0x0) {
      local_7c = 3;
    }
    else {
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_68);
      pcVar2 = kj::_::NullableValue<char>::operator*((NullableValue<char> *)(local_78 + 2));
      pcVar2 = mv<char>(pcVar2);
      Vector<char>::add<char>((Vector<char> *)&subInput.begin,pcVar2);
      local_7c = 0;
    }
    kj::_::NullableValue<char>::~NullableValue((NullableValue<char> *)(local_78 + 2));
    if (local_7c == 0) {
      local_7c = 0;
    }
    capnp::compiler::Lexer::ParserInput::~ParserInput((ParserInput *)local_68);
  } while (local_7c == 0);
  Vector<char>::releaseAsArray(&local_98,(Vector<char> *)&subInput.begin);
  Maybe<kj::Array<char>_>::Maybe(__return_storage_ptr__,&local_98);
  Array<char>::~Array(&local_98);
  local_7c = 1;
  Vector<char>::~Vector((Vector<char> *)&subInput.begin);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }